

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_i4rescale(fitsfile *infptr,int naxis,long *naxes,double rescale,fitsfile *outfptr,int *status
                )

{
  int *array;
  long in_RCX;
  size_t *in_RDX;
  int in_ESI;
  int *in_R8;
  fitsfile *in_XMM0_Qa;
  double dVar1;
  int *unaff_retaddr;
  int *in_stack_00000008;
  int checknull;
  int tstatus;
  int anynul;
  int nullvalue;
  int *intarray;
  long ny;
  long nx;
  long nelem;
  long jj;
  long ii;
  int *in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  long nelem_00;
  fitsfile *fptr;
  int *array_00;
  fitsfile *in_stack_ffffffffffffffb8;
  long lVar4;
  int local_4;
  
  array_00 = (int *)0x1;
  uVar2 = 1;
  fptr = (fitsfile *)*in_RDX;
  nelem_00 = 1;
  for (lVar4 = 1; lVar4 < in_ESI; lVar4 = lVar4 + 1) {
    nelem_00 = nelem_00 * in_RDX[lVar4];
  }
  array = (int *)calloc((size_t)fptr,4);
  if (array == (int *)0x0) {
    *in_R8 = 0x71;
    local_4 = *in_R8;
  }
  else {
    iVar3 = 0;
    ffgky(fptr,(int)((ulong)nelem_00 >> 0x20),(char *)array,
          (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(char *)(ulong)uVar2
          ,(int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (iVar3 != 0) {
      uVar2 = 0;
    }
    ffpscl((fitsfile *)CONCAT44(iVar3,uVar2),
           (double)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
           in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    ffpscl((fitsfile *)CONCAT44(iVar3,uVar2),
           (double)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
           in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    for (lVar4 = 0; lVar4 < nelem_00; lVar4 = lVar4 + 1) {
      ffgpvk(in_XMM0_Qa,in_RCX,(LONGLONG)in_R8,lVar4,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20)
             ,array_00,unaff_retaddr,in_stack_00000008);
      if (uVar2 == 0) {
        for (in_stack_ffffffffffffffb8 = (fitsfile *)0x0;
            (long)in_stack_ffffffffffffffb8 < (long)fptr;
            in_stack_ffffffffffffffb8 =
                 (fitsfile *)((long)&in_stack_ffffffffffffffb8->HDUposition + 1)) {
          if ((double)array[(long)in_stack_ffffffffffffffb8] / (double)in_XMM0_Qa < 0.0) {
            dVar1 = (double)array[(long)in_stack_ffffffffffffffb8] / (double)in_XMM0_Qa - 0.5;
          }
          else {
            dVar1 = (double)array[(long)in_stack_ffffffffffffffb8] / (double)in_XMM0_Qa + 0.5;
          }
          array[(long)in_stack_ffffffffffffffb8] = (int)dVar1;
        }
      }
      else {
        for (in_stack_ffffffffffffffb8 = (fitsfile *)0x0;
            (long)in_stack_ffffffffffffffb8 < (long)fptr;
            in_stack_ffffffffffffffb8 =
                 (fitsfile *)((long)&in_stack_ffffffffffffffb8->HDUposition + 1)) {
          if (array[(long)in_stack_ffffffffffffffb8] != in_stack_ffffffffffffff94) {
            if ((double)array[(long)in_stack_ffffffffffffffb8] / (double)in_XMM0_Qa < 0.0) {
              dVar1 = (double)array[(long)in_stack_ffffffffffffffb8] / (double)in_XMM0_Qa - 0.5;
            }
            else {
              dVar1 = (double)array[(long)in_stack_ffffffffffffffb8] / (double)in_XMM0_Qa + 0.5;
            }
            array[(long)in_stack_ffffffffffffffb8] = (int)dVar1;
          }
        }
      }
      ffpprk(in_stack_ffffffffffffffb8,(long)array_00,(LONGLONG)fptr,nelem_00,array,
             (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      array_00 = (int *)((long)&fptr->HDUposition + (long)array_00);
    }
    free(array);
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int fp_i4rescale(fitsfile *infptr, int naxis, long *naxes, double rescale,
    fitsfile *outfptr, int *status)
{
/*
    divide the integer pixel values in the input file by rescale,
    and write back out to the output file..
*/

	long ii, jj, nelem = 1, nx, ny;
	int *intarray, nullvalue;
	int anynul, tstatus, checknull = 1;
	
	nx = naxes[0];
	ny = 1;
	
	for (ii = 1; ii < naxis; ii++) {
	    ny = ny * naxes[ii];
	}

	intarray = calloc(nx, sizeof(int));
	if (!intarray) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* read the null value keyword (BLANK) if present */
	tstatus = 0;
	fits_read_key(infptr, TINT, "BLANK", &nullvalue, 0, &tstatus);
	if (tstatus) {
	   checknull = 0;
	}

	/* turn off any scaling of the integer pixel values */
	fits_set_bscale(infptr,  1.0, 0.0, status);
	fits_set_bscale(outfptr, 1.0, 0.0, status);

	for (ii = 0; ii < ny; ii++) {

	    fits_read_img_int(infptr, 1, nelem, nx,
	        0, intarray, &anynul, status);

	    if (checknull) {
	        for (jj = 0; jj < nx; jj++) {
	            if (intarray[jj] != nullvalue)
		        intarray[jj] = NINT( (intarray[jj] / rescale) );
		}
	    } else {
	        for (jj = 0; jj < nx; jj++)
		        intarray[jj] = NINT( (intarray[jj] / rescale) );
	    }

	    fits_write_img_int(outfptr, 1, nelem, nx, intarray, status);
	      
	    nelem += nx;
	}

	free(intarray);
	return(*status);
}